

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

aiLight * __thiscall
Assimp::BlenderImporter::ConvertLight
          (BlenderImporter *this,Scene *param_1,Object *obj,Lamp *lamp,ConversionData *param_4)

{
  ai_uint32 aVar1;
  aiLight *paVar2;
  size_t sVar3;
  char *__s;
  float fVar4;
  float fVar5;
  float fVar6;
  
  paVar2 = (aiLight *)operator_new(0x46c);
  (paVar2->mName).length = 0;
  (paVar2->mName).data[0] = '\0';
  memset((paVar2->mName).data + 1,0x1b,0x3ff);
  paVar2->mType = aiLightSource_UNDEFINED;
  (paVar2->mPosition).x = 0.0;
  (paVar2->mPosition).y = 0.0;
  (paVar2->mPosition).z = 0.0;
  (paVar2->mDirection).x = 0.0;
  (paVar2->mDirection).y = 0.0;
  *(undefined8 *)&(paVar2->mDirection).z = 0;
  (paVar2->mUp).x = 0.0;
  (paVar2->mUp).y = 0.0;
  *(undefined8 *)&(paVar2->mUp).z = 0;
  paVar2->mAttenuationLinear = 1.0;
  paVar2->mAttenuationQuadratic = 0.0;
  (paVar2->mColorDiffuse).r = 0.0;
  (paVar2->mColorDiffuse).g = 0.0;
  (paVar2->mColorDiffuse).b = 0.0;
  (paVar2->mColorSpecular).r = 0.0;
  (paVar2->mColorSpecular).g = 0.0;
  *(undefined8 *)&(paVar2->mColorSpecular).b = 0;
  (paVar2->mColorAmbient).g = 0.0;
  (paVar2->mColorAmbient).b = 0.0;
  paVar2->mAngleInnerCone = 6.2831855;
  paVar2->mAngleOuterCone = 6.2831855;
  (paVar2->mSize).x = 0.0;
  (paVar2->mSize).y = 0.0;
  __s = (obj->id).name + 2;
  sVar3 = strlen(__s);
  aVar1 = (ai_uint32)sVar3;
  if ((int)aVar1 < 0x400) {
    (paVar2->mName).length = aVar1;
    memcpy((paVar2->mName).data,__s,(long)(int)aVar1);
    (paVar2->mName).data[(int)aVar1] = '\0';
  }
  if (Type_Area < lamp->type) goto switchD_00498426_caseD_3;
  switch(lamp->type) {
  case Type_Local:
    paVar2->mType = aiLightSource_POINT;
    break;
  case Type_Sun:
    paVar2->mType = aiLightSource_DIRECTIONAL;
    goto LAB_004984c1;
  case Type_Spot:
    paVar2->mType = aiLightSource_SPOT;
    (paVar2->mDirection).x = 0.0;
    (paVar2->mDirection).y = 0.0;
    *(undefined8 *)&(paVar2->mDirection).z = 0xbf800000;
    (paVar2->mUp).y = 1.0;
    (paVar2->mUp).z = 0.0;
    fVar4 = lamp->spotsize;
    paVar2->mAngleInnerCone = (1.0 - lamp->spotblend) * fVar4;
    paVar2->mAngleOuterCone = fVar4;
    break;
  case Type_Area:
    paVar2->mType = aiLightSource_AREA;
    fVar4 = lamp->area_size;
    if (lamp->area_shape != 0) {
      fVar4 = lamp->area_sizey;
    }
    (paVar2->mSize).x = lamp->area_size;
    (paVar2->mSize).y = fVar4;
LAB_004984c1:
    (paVar2->mDirection).x = 0.0;
    (paVar2->mDirection).y = 0.0;
    *(undefined8 *)&(paVar2->mDirection).z = 0xbf800000;
    (paVar2->mUp).y = 1.0;
    (paVar2->mUp).z = 0.0;
  }
switchD_00498426_caseD_3:
  fVar4 = lamp->energy;
  fVar5 = lamp->r * fVar4;
  fVar6 = lamp->g * fVar4;
  fVar4 = fVar4 * lamp->b;
  (paVar2->mColorAmbient).r = fVar5;
  (paVar2->mColorAmbient).g = fVar6;
  (paVar2->mColorAmbient).b = fVar4;
  (paVar2->mColorSpecular).r = fVar5;
  (paVar2->mColorSpecular).g = fVar6;
  (paVar2->mColorSpecular).b = fVar4;
  (paVar2->mColorDiffuse).r = fVar5;
  (paVar2->mColorDiffuse).g = fVar6;
  (paVar2->mColorDiffuse).b = fVar4;
  fVar4 = lamp->constant_coefficient;
  if ((((fVar4 != 1.0) || (NAN(fVar4))) || (lamp->linear_coefficient != 0.0)) ||
     (((NAN(lamp->linear_coefficient) || (lamp->quadratic_coefficient != 0.0)) ||
      ((NAN(lamp->quadratic_coefficient) || (fVar5 = lamp->dist, fVar5 <= 0.0)))))) {
    paVar2->mAttenuationConstant = fVar4;
    paVar2->mAttenuationLinear = lamp->linear_coefficient;
    fVar4 = lamp->quadratic_coefficient;
  }
  else {
    paVar2->mAttenuationConstant = 1.0;
    paVar2->mAttenuationLinear = 2.0 / fVar5;
    fVar4 = 1.0 / (fVar5 * fVar5);
  }
  paVar2->mAttenuationQuadratic = fVar4;
  return paVar2;
}

Assistant:

aiLight* BlenderImporter::ConvertLight(const Scene& /*in*/, const Object* obj, const Lamp* lamp, ConversionData& /*conv_data*/)
{
    std::unique_ptr<aiLight> out(new aiLight());
    out->mName = obj->id.name+2;

    switch (lamp->type)
    {
        case Lamp::Type_Local:
            out->mType = aiLightSource_POINT;
            break;
        case Lamp::Type_Spot:
            out->mType = aiLightSource_SPOT;

            // blender orients directional lights as facing toward -z
            out->mDirection = aiVector3D(0.f, 0.f, -1.f);
            out->mUp = aiVector3D(0.f, 1.f, 0.f);

            out->mAngleInnerCone = lamp->spotsize * (1.0f - lamp->spotblend);
            out->mAngleOuterCone = lamp->spotsize;
            break;
        case Lamp::Type_Sun:
            out->mType = aiLightSource_DIRECTIONAL;

            // blender orients directional lights as facing toward -z
            out->mDirection = aiVector3D(0.f, 0.f, -1.f);
            out->mUp = aiVector3D(0.f, 1.f, 0.f);
            break;

        case Lamp::Type_Area:
            out->mType = aiLightSource_AREA;

            if (lamp->area_shape == 0) {
                out->mSize = aiVector2D(lamp->area_size, lamp->area_size);
            }
            else {
                out->mSize = aiVector2D(lamp->area_size, lamp->area_sizey);
            }

            // blender orients directional lights as facing toward -z
            out->mDirection = aiVector3D(0.f, 0.f, -1.f);
            out->mUp = aiVector3D(0.f, 1.f, 0.f);
            break;

        default:
            break;
    }

    out->mColorAmbient = aiColor3D(lamp->r, lamp->g, lamp->b) * lamp->energy;
    out->mColorSpecular = aiColor3D(lamp->r, lamp->g, lamp->b) * lamp->energy;
    out->mColorDiffuse = aiColor3D(lamp->r, lamp->g, lamp->b) * lamp->energy;

    // If default values are supplied, compute the coefficients from light's max distance
    // Read this: https://imdoingitwrong.wordpress.com/2011/01/31/light-attenuation/
    //
    if (lamp->constant_coefficient == 1.0f && lamp->linear_coefficient == 0.0f && lamp->quadratic_coefficient == 0.0f && lamp->dist > 0.0f)
    {
        out->mAttenuationConstant = 1.0f;
        out->mAttenuationLinear = 2.0f / lamp->dist;
        out->mAttenuationQuadratic = 1.0f / (lamp->dist * lamp->dist);
    }
    else
    {
        out->mAttenuationConstant = lamp->constant_coefficient;
        out->mAttenuationLinear = lamp->linear_coefficient;
        out->mAttenuationQuadratic = lamp->quadratic_coefficient;
    }

    return out.release();
}